

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_late(Impl *this)

{
  if (this->execution_model == ExecutionModelFragment) {
    emit_execution_modes_pixel_late(this);
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_late()
{
	switch (execution_model)
	{
	case spv::ExecutionModelFragment:
		if (!emit_execution_modes_pixel_late())
			return false;
		break;

	default:
		break;
	}

	return true;
}